

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

MontgomeryCurve * mcurve(void)

{
  mp_int *p_00;
  mp_int *a_00;
  mp_int *b_00;
  MontgomeryCurve *pMVar1;
  MontgomeryCurve *mc;
  mp_int *b;
  mp_int *a;
  mp_int *p;
  
  p_00 = mp__from_string_literal("0xde978eb1db35236a5792e9f0c04d86000659");
  a_00 = mp__from_string_literal("0x799b62a612b1b30e1c23cea6d67b2e33c51a");
  b_00 = mp__from_string_literal("0x944bf9042b56821a8c9e0b49b636c2502b2b");
  pMVar1 = ecc_montgomery_curve(p_00,a_00,b_00);
  mp_free(p_00);
  mp_free(a_00);
  mp_free(b_00);
  return pMVar1;
}

Assistant:

static MontgomeryCurve *mcurve(void)
{
    mp_int *p = MP_LITERAL(0xde978eb1db35236a5792e9f0c04d86000659);
    mp_int *a = MP_LITERAL(0x799b62a612b1b30e1c23cea6d67b2e33c51a);
    mp_int *b = MP_LITERAL(0x944bf9042b56821a8c9e0b49b636c2502b2b);
    MontgomeryCurve *mc = ecc_montgomery_curve(p, a, b);
    mp_free(p);
    mp_free(a);
    mp_free(b);
    return mc;
}